

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O3

void __thiscall slang::ast::UnrollVisitor::runForReal(UnrollVisitor *this,ForLoopStatement *loop)

{
  IntervalMap<unsigned_long,_std::monostate,_0U> *this_00;
  AssignmentExpression *pAVar1;
  SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL> *pSVar2;
  size_type sVar3;
  uint uVar4;
  ushort uVar5;
  bool bVar6;
  Symbol *args_2;
  undefined8 *puVar7;
  ValueDriver *driver;
  char_pointer puVar8;
  uint uVar9;
  char_pointer puVar10;
  long lVar11;
  char_pointer puVar12;
  undefined8 *puVar13;
  table_element_pointer ppVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  iterator iVar19;
  iterator iVar20;
  DriverBitRange bounds;
  iterator it;
  char_pointer local_d8;
  const_iterator local_b0;
  iterator local_70;
  
  this->anyErrors = false;
  this->setupMode = false;
  EvalContext::reset(&this->evalCtx);
  EvalContext::pushEmptyFrame(&this->evalCtx);
  if ((loop->super_Statement).kind != Invalid) {
    handle(this,loop);
  }
  if (this->anyErrors == true) {
    iVar19 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*,_void>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>_>_>
             ::begin(&(this->driverMap).table_);
    if (iVar19.p_ != (table_element_pointer)0x0) {
LAB_004e44c1:
      do {
        pAVar1 = (iVar19.p_)->first;
        Expression::requireLValue
                  (pAVar1->left_,this->astCtx,(SourceLocation)0x0,
                   (bitmask<slang::ast::AssignFlags>)
                   (underlying_type)*(undefined4 *)&pAVar1->nonBlocking,(Expression *)0x0);
        puVar10 = iVar19.pc_ + 0x12;
        puVar12 = iVar19.pc_ + 2;
        while( true ) {
          puVar8 = puVar12;
          puVar12 = iVar19.pc_;
          ppVar14 = iVar19.p_ + 1;
          if (((uint)iVar19.pc_ & 0xf) == 0xe) break;
          iVar19.p_ = ppVar14;
          iVar19.pc_ = puVar12 + 1;
          puVar10 = puVar10 + 1;
          puVar12 = puVar8 + 1;
          if (puVar8[-1] != '\0') goto code_r0x004e450f;
        }
        auVar15[0] = -(*puVar8 == '\0');
        auVar15[1] = -(puVar8[1] == '\0');
        auVar15[2] = -(puVar8[2] == '\0');
        auVar15[3] = -(puVar8[3] == '\0');
        auVar15[4] = -(puVar8[4] == '\0');
        auVar15[5] = -(puVar8[5] == '\0');
        auVar15[6] = -(puVar8[6] == '\0');
        auVar15[7] = -(puVar8[7] == '\0');
        auVar15[8] = -(puVar8[8] == '\0');
        auVar15[9] = -(puVar8[9] == '\0');
        auVar15[10] = -(puVar8[10] == '\0');
        auVar15[0xb] = -(puVar8[0xb] == '\0');
        auVar15[0xc] = -(puVar8[0xc] == '\0');
        auVar15[0xd] = -(puVar8[0xd] == '\0');
        auVar15[0xe] = -(puVar8[0xe] == '\0');
        auVar15[0xf] = -(puVar8[0xf] == '\0');
        uVar5 = (ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe;
        while (uVar5 == 0x7fff) {
          ppVar14 = ppVar14 + 0xf;
          auVar16[0] = -(*puVar10 == '\0');
          auVar16[1] = -(puVar10[1] == '\0');
          auVar16[2] = -(puVar10[2] == '\0');
          auVar16[3] = -(puVar10[3] == '\0');
          auVar16[4] = -(puVar10[4] == '\0');
          auVar16[5] = -(puVar10[5] == '\0');
          auVar16[6] = -(puVar10[6] == '\0');
          auVar16[7] = -(puVar10[7] == '\0');
          auVar16[8] = -(puVar10[8] == '\0');
          auVar16[9] = -(puVar10[9] == '\0');
          auVar16[10] = -(puVar10[10] == '\0');
          auVar16[0xb] = -(puVar10[0xb] == '\0');
          auVar16[0xc] = -(puVar10[0xc] == '\0');
          auVar16[0xd] = -(puVar10[0xd] == '\0');
          auVar16[0xe] = -(puVar10[0xe] == '\0');
          auVar16[0xf] = -(puVar10[0xf] == '\0');
          puVar8 = puVar10;
          puVar10 = puVar10 + 0x10;
          uVar5 = (ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe;
        }
        uVar9 = uVar5 ^ 0x7fff;
        uVar4 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        if (puVar8[uVar4] == '\x01') {
          return;
        }
        iVar19.p_ = (table_element_pointer)((long)&ppVar14->first + (ulong)(uVar4 << 4));
        iVar19.pc_ = puVar8 + uVar4;
      } while( true );
    }
  }
  else {
    args_2 = ASTContext::getContainingSymbol(this->astCtx);
    iVar20 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*,_void>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>_>_>
             ::begin(&(this->driverMap).table_);
    if (iVar20.p_ != (table_element_pointer)0x0) {
LAB_004e45b2:
      do {
        local_d8 = iVar20.pc_;
        pSVar2 = ((iVar20.p_)->second)._M_t.
                 super___uniq_ptr_impl<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_*,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
                 .
                 super__Head_base<0UL,_slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_*,_false>
                 ._M_head_impl;
        sVar3 = (pSVar2->super_SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState>).len
        ;
        if (sVar3 != 0) {
          puVar13 = &(((pSVar2->
                       super_SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState>).data_
                      )->longestStaticPrefix).ptr;
          puVar7 = puVar13 + sVar3 * 0x1c;
          do {
            local_b0.map._0_1_ = 0;
            local_70.super_const_iterator.map._0_1_ = 0;
            driver = BumpAllocator::
                     emplace<slang::ast::ValueDriver,slang::ast::DriverKind,slang::ast::Expression_const&,slang::ast::Symbol_const&,slang::ast::AssignFlags>
                               (&this->comp->super_BumpAllocator,(DriverKind *)&local_b0,
                                (Expression *)*puVar13,args_2,(AssignFlags *)&local_70);
            this_00 = (IntervalMap<unsigned_long,_std::monostate,_0U> *)(puVar13 + 3);
            IntervalMap<unsigned_long,_std::monostate,_0U>::begin((iterator *)&local_b0,this_00);
            while( true ) {
              IntervalMap<unsigned_long,_std::monostate,_0U>::end(&local_70,this_00);
              bVar6 = IntervalMapDetails::Path::operator==
                                (&local_b0.path,&local_70.super_const_iterator.path);
              if (local_70.super_const_iterator.path.path.
                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
                  (pointer)local_70.super_const_iterator.path.path.
                           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                           firstElement) {
                operator_delete(local_70.super_const_iterator.path.path.
                                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)
                ;
              }
              if (bVar6) break;
              lVar11 = (ulong)local_b0.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                              [local_b0.path.path.
                               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1
                              ].offset * 0x10;
              bounds.second =
                   *(unsigned_long *)
                    ((long)local_b0.path.path.
                           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                           [local_b0.path.path.
                            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                           node + lVar11 + 8);
              bounds.first = *(unsigned_long *)
                              ((long)local_b0.path.path.
                                     super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                     data_[local_b0.path.path.
                                           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                           .len - 1].node + lVar11);
              ValueSymbol::addDriver((ValueSymbol *)puVar13[1],bounds,driver);
              IntervalMap<unsigned_long,_std::monostate,_0U>::const_iterator::operator++(&local_b0);
            }
            if (local_b0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                data_ != (pointer)local_b0.path.path.
                                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                  firstElement) {
              operator_delete(local_b0.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
            }
            IntervalMap<unsigned_long,_std::monostate,_0U>::clear
                      (this_00,&this->comp->unrollIntervalMapAllocator);
            puVar13 = puVar13 + 0x1c;
          } while (puVar13 != puVar7);
        }
        puVar10 = local_d8 + 0x12;
        puVar12 = local_d8 + 2;
        while( true ) {
          puVar8 = puVar12;
          puVar12 = iVar20.pc_;
          ppVar14 = iVar20.p_ + 1;
          if (((uint)iVar20.pc_ & 0xf) == 0xe) break;
          iVar20.p_ = ppVar14;
          iVar20.pc_ = puVar12 + 1;
          puVar10 = puVar10 + 1;
          puVar12 = puVar8 + 1;
          if (puVar8[-1] != '\0') goto code_r0x004e4708;
        }
        auVar17[0] = -(*puVar8 == '\0');
        auVar17[1] = -(puVar8[1] == '\0');
        auVar17[2] = -(puVar8[2] == '\0');
        auVar17[3] = -(puVar8[3] == '\0');
        auVar17[4] = -(puVar8[4] == '\0');
        auVar17[5] = -(puVar8[5] == '\0');
        auVar17[6] = -(puVar8[6] == '\0');
        auVar17[7] = -(puVar8[7] == '\0');
        auVar17[8] = -(puVar8[8] == '\0');
        auVar17[9] = -(puVar8[9] == '\0');
        auVar17[10] = -(puVar8[10] == '\0');
        auVar17[0xb] = -(puVar8[0xb] == '\0');
        auVar17[0xc] = -(puVar8[0xc] == '\0');
        auVar17[0xd] = -(puVar8[0xd] == '\0');
        auVar17[0xe] = -(puVar8[0xe] == '\0');
        auVar17[0xf] = -(puVar8[0xf] == '\0');
        uVar5 = (ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe;
        while (uVar5 == 0x7fff) {
          ppVar14 = ppVar14 + 0xf;
          auVar18[0] = -(*puVar10 == '\0');
          auVar18[1] = -(puVar10[1] == '\0');
          auVar18[2] = -(puVar10[2] == '\0');
          auVar18[3] = -(puVar10[3] == '\0');
          auVar18[4] = -(puVar10[4] == '\0');
          auVar18[5] = -(puVar10[5] == '\0');
          auVar18[6] = -(puVar10[6] == '\0');
          auVar18[7] = -(puVar10[7] == '\0');
          auVar18[8] = -(puVar10[8] == '\0');
          auVar18[9] = -(puVar10[9] == '\0');
          auVar18[10] = -(puVar10[10] == '\0');
          auVar18[0xb] = -(puVar10[0xb] == '\0');
          auVar18[0xc] = -(puVar10[0xc] == '\0');
          auVar18[0xd] = -(puVar10[0xd] == '\0');
          auVar18[0xe] = -(puVar10[0xe] == '\0');
          auVar18[0xf] = -(puVar10[0xf] == '\0');
          puVar8 = puVar10;
          puVar10 = puVar10 + 0x10;
          uVar5 = (ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe;
        }
        uVar4 = 0;
        if ((uVar5 ^ 0x7fff) != 0) {
          for (; ((uVar5 ^ 0x7fff) >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        if (puVar8[uVar4] == '\x01') {
          return;
        }
        iVar20.p_ = (table_element_pointer)((long)&ppVar14->first + (ulong)(uVar4 << 4));
        iVar20.pc_ = puVar8 + uVar4;
      } while( true );
    }
  }
  return;
code_r0x004e4708:
  if (puVar8[-1] == '\x01') {
    return;
  }
  iVar20.pc_ = puVar8 + -1;
  goto LAB_004e45b2;
code_r0x004e450f:
  if (puVar8[-1] == '\x01') {
    return;
  }
  iVar19.pc_ = puVar8 + -1;
  goto LAB_004e44c1;
}

Assistant:

void runForReal(const ForLoopStatement& loop) {
        // Revisit the loop with setupMode turned off.
        anyErrors = false;
        setupMode = false;
        evalCtx.reset();
        evalCtx.pushEmptyFrame();
        visit(loop);

        if (anyErrors) {
            // We can't correctly apply our collected intervals if there are errors,
            // so just visit each assignment expression like normal to make sure
            // errors get issued.
            for (auto& [expr, stateVec] : driverMap) {
                auto flags = expr->isNonBlocking() ? AssignFlags::NonBlocking : AssignFlags::None;
                expr->left().requireLValue(astCtx, {}, flags);
            }
        }
        else {
            // Find our finished driver interval maps and apply them.
            auto& containingSym = astCtx.getContainingSymbol();
            for (auto& [expr, stateVec] : driverMap) {
                for (auto& state : *stateVec) {
                    auto driver = comp.emplace<ValueDriver>(DriverKind::Procedural,
                                                            *state.longestStaticPrefix,
                                                            containingSym, AssignFlags::None);

                    for (auto it = state.intervals.begin(); it != state.intervals.end(); ++it)
                        state.symbol->addDriver(it.bounds(), *driver);

                    state.intervals.clear(comp.getUnrollIntervalMapAllocator());
                }
            }
        }
    }